

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcrypt_pbkdf.c
# Opt level: O0

void bcrypt_hash(uint8_t *sha2pass,uint8_t *sha2salt,uint8_t *out)

{
  uint32_t uVar1;
  size_t shalen;
  uint16_t j;
  int i;
  uint32_t cdata [8];
  uint8_t ciphertext [32];
  blf_ctx state;
  uint8_t *out_local;
  uint8_t *sha2salt_local;
  uint8_t *sha2pass_local;
  
  cdata[6] = 0x6379784f;
  cdata[7] = 0x6d6f7268;
  builtin_memcpy(ciphertext,"aticBlowfishSwatDynamite",0x18);
  Blowfish_initstate((blf_ctx *)(ciphertext + 0x18));
  Blowfish_expandstate((blf_ctx *)(ciphertext + 0x18),sha2salt,0x40,sha2pass,0x40);
  for (shalen._4_4_ = 0; shalen._4_4_ < 0x40; shalen._4_4_ = shalen._4_4_ + 1) {
    Blowfish_expand0state((blf_ctx *)(ciphertext + 0x18),sha2salt,0x40);
    Blowfish_expand0state((blf_ctx *)(ciphertext + 0x18),sha2pass,0x40);
  }
  shalen._2_2_ = 0;
  for (shalen._4_4_ = 0; shalen._4_4_ < 8; shalen._4_4_ = shalen._4_4_ + 1) {
    uVar1 = Blowfish_stream2word((uint8_t *)(cdata + 6),0x20,(uint16_t *)((long)&shalen + 2));
    cdata[(long)shalen._4_4_ + -2] = uVar1;
  }
  for (shalen._4_4_ = 0; shalen._4_4_ < 0x40; shalen._4_4_ = shalen._4_4_ + 1) {
    blf_enc((blf_ctx *)(ciphertext + 0x18),(uint32_t *)&stack0xffffffffffffef58,4);
  }
  for (shalen._4_4_ = 0; shalen._4_4_ < 8; shalen._4_4_ = shalen._4_4_ + 1) {
    out[shalen._4_4_ * 4 + 3] = (uint8_t)(cdata[(long)shalen._4_4_ + -2] >> 0x18);
    out[shalen._4_4_ * 4 + 2] = (uint8_t)(cdata[(long)shalen._4_4_ + -2] >> 0x10);
    out[shalen._4_4_ * 4 + 1] = (uint8_t)(cdata[(long)shalen._4_4_ + -2] >> 8);
    out[shalen._4_4_ << 2] = (uint8_t)cdata[(long)shalen._4_4_ + -2];
  }
  _libssh2_explicit_zero(cdata + 6,0x20);
  _libssh2_explicit_zero(&stack0xffffffffffffef58,0x20);
  _libssh2_explicit_zero(ciphertext + 0x18,0x1048);
  return;
}

Assistant:

static void
bcrypt_hash(uint8_t *sha2pass, uint8_t *sha2salt, uint8_t *out)
{
    blf_ctx state;
    uint8_t ciphertext[BCRYPT_HASHSIZE] =
        "OxychromaticBlowfishSwatDynamite";
    uint32_t cdata[BCRYPT_BLOCKS];
    int i;
    uint16_t j;
    size_t shalen = SHA512_DIGEST_LENGTH;

    /* key expansion */
    Blowfish_initstate(&state);
    Blowfish_expandstate(&state, sha2salt, shalen, sha2pass, shalen);
    for(i = 0; i < 64; i++) {
        Blowfish_expand0state(&state, sha2salt, shalen);
        Blowfish_expand0state(&state, sha2pass, shalen);
    }

    /* encryption */
    j = 0;
    for(i = 0; i < BCRYPT_BLOCKS; i++)
        cdata[i] = Blowfish_stream2word(ciphertext, sizeof(ciphertext),
                                        &j);
    for(i = 0; i < 64; i++)
        blf_enc(&state, cdata, BCRYPT_BLOCKS / 2);

    /* copy out */
    for(i = 0; i < BCRYPT_BLOCKS; i++) {
        out[4 * i + 3] = (cdata[i] >> 24) & 0xff;
        out[4 * i + 2] = (cdata[i] >> 16) & 0xff;
        out[4 * i + 1] = (cdata[i] >> 8) & 0xff;
        out[4 * i + 0] = cdata[i] & 0xff;
    }

    /* zap */
    _libssh2_explicit_zero(ciphertext, sizeof(ciphertext));
    _libssh2_explicit_zero(cdata, sizeof(cdata));
    _libssh2_explicit_zero(&state, sizeof(state));
}